

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetNumFailsEtaMaxErrFail(void *cvode_mem,int small_nef)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetNumFailsEtaMaxErrFail",
                   "cvode_mem = NULL illegal.");
  }
  else {
    if (small_nef < 0) {
      *(undefined4 *)((long)cvode_mem + 0x350) = 2;
    }
    else {
      *(int *)((long)cvode_mem + 0x350) = small_nef;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetNumFailsEtaMaxErrFail(void* cvode_mem, int small_nef)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetNumFailsEtaMaxErrFail",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (small_nef < 0)
    cv_mem->cv_small_nef = SMALL_NEF_DEFAULT;
  else
    cv_mem->cv_small_nef = small_nef;

  return(CV_SUCCESS);
}